

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O0

ktx_uint32_t ktxTexture2_calcRequiredLevelAlignment(ktxTexture2 *This)

{
  long in_RDI;
  ktx_uint32_t alignment;
  uint32_t in_stack_fffffffffffffff0;
  undefined4 local_c;
  
  if (*(int *)(in_RDI + 0x88) == 0) {
    local_c = lcm4(in_stack_fffffffffffffff0);
  }
  else {
    local_c = 1;
  }
  return local_c;
}

Assistant:

ktx_uint32_t
 ktxTexture2_calcRequiredLevelAlignment(ktxTexture2* This)
 {
    ktx_uint32_t alignment;
    if (This->supercompressionScheme != KTX_SS_NONE)
        alignment = 1;
    else
        alignment = lcm4(This->_protected->_formatSize.blockSizeInBits / 8);
    return alignment;
 }